

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O3

void __thiscall SPTest_RandomRHSInNonlinear_Test::TestBody(SPTest_RandomRHSInNonlinear_Test *this)

{
  FunctionMocker<void_(int,_double)> *this_00;
  int iVar1;
  pointer piVar2;
  ExprBase expr;
  MockSpec<void_(int,_double)> *this_01;
  MutAlgebraicCon MVar3;
  ColumnSizeHandler cols;
  MockScenarioHandler handler;
  TestProblem p;
  SPAdapter sp;
  NLHeader header;
  ColumnSizeHandler local_878;
  Matcher<double> local_870;
  Matcher<int> local_858;
  MockScenarioHandler local_840;
  undefined1 local_728 [16];
  pointer local_718;
  undefined **local_6f0;
  pointer local_3d0;
  pointer local_3c0;
  pointer local_3b8;
  pointer local_3a8;
  pointer local_3a0;
  pointer local_390;
  ColProblem *local_380;
  SPAdapter local_378;
  NLHeader local_130;
  
  memset(&local_130,0,0xa8);
  local_130.super_NLInfo.super_NLInfo_C.format = 1;
  local_130.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_130.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_130.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_130.super_NLInfo.super_NLInfo_C.arith_kind = 1;
  local_130.super_NLInfo.super_NLInfo_C.flags = 1;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  local_130.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = 2;
  local_130.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem((TestProblem *)local_728,&local_130);
  TestProblem::MakeTestRV((TestProblem *)local_728);
  MVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)local_728,0.0,0.0);
  local_378.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)(local_728 + 8),(Impl **)&local_378);
  expr.impl_ = (Impl *)operator_new__(0x40);
  (expr.impl_)->kind_ = FIRST_REFERENCE;
  ((ExprBase *)(local_718 + -1))->impl_ = expr.impl_;
  expr.impl_[1].kind_ = UNKNOWN;
  if (expr.impl_ != (Impl *)0x0) {
    mp::BasicProblem<mp::BasicProblemParams<int>_>::SetNonlinearConExpr
              (MVar3.
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
               MVar3.
               super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,
               (NumericExpr)expr.impl_);
  }
  local_878.problem_ = local_380;
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&local_878,1);
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&local_878,0);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             (local_380->super_Problem).algebraic_cons_.
             super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  piVar2 = (local_380->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  (local_380->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = 0;
  (local_380->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = -3.0;
  mp::SPAdapter::SPAdapter(&local_378,(ColProblem *)local_728);
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_840);
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<2UL,_testing::Matcher<double>_>.
  super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
       + 0x10);
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<2UL,_testing::Matcher<double>_>.
  super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<2UL,_testing::Matcher<double>_>.
  super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00199238;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_840.gmock3_OnTerm_551.
                        super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                + 0x28);
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992a0;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_840.gmock3_OnTerm_551.
                        super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                + 0x40);
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992a0;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00199168;
  this_00 = &local_840.gmock2_OnRHS_552;
  local_840.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<void_(int,_int,_double)> *)&local_840;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_
               .matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
       0x10);
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00199238;
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
                0x28);
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992a0;
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001993b8;
  local_840.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.
  function_mocker_ = &this_00->super_FunctionMockerBase<void_(int,_double)>;
  testing::Matcher<int>::Matcher(&local_858,0);
  testing::Matcher<double>::Matcher(&local_870,44.0);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&local_840);
  this_01 = testing::internal::FunctionMocker<void_(int,_double)>::With
                      (this_00,&local_858,&local_870);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (this_01,"/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",
             0x249,"handler","OnRHS(0, 44)");
  local_870.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00199280;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            (&local_870.super_MatcherBase<double>.impl_);
  local_858.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_858.super_MatcherBase<int>.impl_);
  mp::SPAdapter::GetScenario<MockScenarioHandler>(&local_378,0,&local_840);
  testing::internal::FunctionMockerBase<void_(int,_double)>::~FunctionMockerBase
            (&this_00->super_FunctionMockerBase<void_(int,_double)>);
  testing::internal::FunctionMockerBase<void_(int,_int,_double)>::~FunctionMockerBase
            ((FunctionMockerBase<void_(int,_int,_double)> *)&local_840);
  mp::SPAdapter::~SPAdapter(&local_378);
  local_728._0_8_ = &PTR__ColProblem_00198718;
  local_6f0 = &PTR__ColProblem_00198738;
  if (local_3a0 != (pointer)0x0) {
    operator_delete(local_3a0,(long)local_390 - (long)local_3a0);
  }
  if (local_3b8 != (pointer)0x0) {
    operator_delete(local_3b8,(long)local_3a8 - (long)local_3b8);
  }
  if (local_3d0 != (pointer)0x0) {
    operator_delete(local_3d0,(long)local_3c0 - (long)local_3d0);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)local_728);
  return;
}

Assistant:

TEST(SPTest, RandomRHSInNonlinear) {
  auto header = MakeHeader(2);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0).set_nonlinear_expr(p.MakeVariable(0));
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  cols.Add(0);
  p.OnLinearConExpr(0).AddTerm(0, -3);
  mp::SPAdapter sp(p);
  MockScenarioHandler handler;
  EXPECT_CALL(handler, OnRHS(0, 44));
  sp.GetScenario(0, handler);
}